

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sender.cc
# Opt level: O0

void open_sockets(sender *s,string *host)

{
  int iVar1;
  void *pvVar2;
  v_array<int> *in_RSI;
  undefined8 *in_RDI;
  char *in_stack_000008c0;
  int *in_stack_ffffffffffffffc8;
  
  std::__cxx11::string::c_str();
  iVar1 = open_socket(in_stack_000008c0);
  *(int *)(in_RDI + 1) = iVar1;
  pvVar2 = operator_new(0xa8);
  io_buf::io_buf((io_buf *)0x2e38ac);
  *in_RDI = pvVar2;
  v_array<int>::push_back(in_RSI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void open_sockets(sender& s, string host)
{
  s.sd = open_socket(host.c_str());
  s.buf = new io_buf();
  s.buf->files.push_back(s.sd);
}